

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::ProblemHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler> *this
          ,int info)

{
  int num_values;
  StringRef name;
  StringRef name_00;
  StringRef SVar1;
  IntSuffixHandler suffix_handler;
  
  num_values = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
               ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
                           *)this,1,2);
  SVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadString
                    (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  if ((info & 4U) == 0) {
    name.size_ = (size_t)SVar1.data_;
    name.data_ = *(char **)(this + 0x10);
    TestNLHandler::OnIntSuffix((TestNLHandler *)&suffix_handler,name,(int)SVar1.size_,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::IntReader,TestNLHandler::SuffixHandler<int>>
              (this,num_values,1,&suffix_handler);
    TestNLHandler::SuffixHandler<int>::~SuffixHandler(&suffix_handler);
  }
  else {
    name_00.size_ = (size_t)SVar1.data_;
    name_00.data_ = *(char **)(this + 0x10);
    TestNLHandler::OnDblSuffix((TestNLHandler *)&suffix_handler,name_00,(int)SVar1.size_,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::DoubleReader,TestNLHandler::SuffixHandler<double>>
              (this,num_values,1,(SuffixHandler<double> *)&suffix_handler);
    TestNLHandler::SuffixHandler<double>::~SuffixHandler((SuffixHandler<double> *)&suffix_handler);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}